

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_array
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  ulong uVar1;
  size_t index_00;
  const_reference pvVar2;
  size_type sVar3;
  JSON *this;
  runtime_error *this_00;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  JSON local_68;
  size_t local_30;
  size_t index;
  size_t *local_20;
  size_t *offset_local;
  string *str_local;
  JSON *Array;
  
  index._7_1_ = 0;
  local_20 = offset;
  offset_local = (size_t *)str;
  str_local = (string *)__return_storage_ptr__;
  JSON::JSON(__return_storage_ptr__,Array);
  local_30 = 0;
  *local_20 = *local_20 + 1;
  consume_ws((string *)offset_local,local_20);
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      offset_local,*local_20);
  if (*pvVar2 == ']') {
    *local_20 = *local_20 + 1;
  }
  else {
    while (uVar1 = *local_20,
          sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       offset_local), uVar1 < sVar3) {
      parse_next(&local_68,(string *)offset_local,local_20);
      index_00 = local_30;
      local_30 = local_30 + 1;
      this = JSON::operator[](__return_storage_ptr__,index_00);
      JSON::operator=(this,&local_68);
      JSON::~JSON(&local_68);
      consume_ws((string *)offset_local,local_20);
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          offset_local,*local_20);
      if (*pvVar2 != ',') {
        pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            offset_local,*local_20);
        if (*pvVar2 == ']') {
          *local_20 = *local_20 + 1;
          return __return_storage_ptr__;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"JSON ERROR: Array: Expected \',\' or \']\', found \'",
                   &local_c9);
        pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            offset_local,*local_20);
        std::operator+(&local_a8,&local_c8,*pvVar2);
        std::operator+(&local_88,&local_a8,"\'\n");
        std::runtime_error::runtime_error(this_00,(string *)&local_88);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *local_20 = *local_20 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_array(const std::string &str, size_t &offset) {
      JSON Array(JSON::Class::Array);
      size_t index = 0;

      ++offset;
      consume_ws(str, offset);
      if (str.at(offset) == ']') {
        ++offset;
        return Array;
      }

      for (; offset < str.size();) {
        Array[index++] = parse_next(str, offset);
        consume_ws(str, offset);

        if (str.at(offset) == ',') {
          ++offset;
          continue;
        } else if (str.at(offset) == ']') {
          ++offset;
          break;
        } else {
          throw std::runtime_error(std::string("JSON ERROR: Array: Expected ',' or ']', found '") + str.at(offset) + "'\n");
        }
      }

      return Array;
    }